

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O3

void test_dt_integer(void)

{
  char cVar1;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  wchar16 *pwVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  void *pvVar10;
  char *pcVar11;
  bool bVar12;
  undefined8 uVar13;
  Status myStatus;
  Status myStatus_14;
  char lex_iv_2 [8];
  char lex_iv_1 [10];
  char data_canrep_2 [6];
  char data_canrep_1 [6];
  char data_rawstr_2 [9];
  char lex_v_ran64_iv_2 [21];
  char lex_v_ran64_iv_1 [21];
  char lex_v_ran64_v_2 [21];
  char lex_v_ran64_v_1 [21];
  char data_rawstr_1 [14];
  char lex_v_ran_v_1 [13];
  char lex_v_ran64_iv_1_canrep [20];
  char lex_v_ran64_v_1_canrep [20];
  char lex_v_ran64_iv_2_canrep [21];
  char lex_v_ran64_v_2_canrep [21];
  StrX local_260;
  char *local_250;
  Status local_244;
  char local_240 [8];
  undefined8 local_238;
  undefined2 local_230;
  char local_22c [8];
  char local_224 [8];
  uint local_21c;
  char local_218 [16];
  char local_208 [32];
  char local_1e8 [32];
  char local_1c8 [32];
  char local_1a8 [32];
  char local_188 [16];
  char local_178 [16];
  char local_168 [32];
  char local_148 [32];
  char local_128 [32];
  char local_108 [24];
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  builtin_strncpy(local_178 + 8,"   \n",5);
  builtin_strncpy(local_178,"   1234 ",8);
  builtin_strncpy(local_1a8,"+9223372036854775807",0x15);
  builtin_strncpy(local_1c8,"-9223372036854775808",0x15);
  builtin_strncpy(local_1e8,"+9223372036854775808",0x15);
  builtin_strncpy(local_208 + 0x10,"5809",5);
  builtin_strncpy(local_208,"-922337203685477",0x10);
  builtin_strncpy(local_148,"9223372036854775807",0x14);
  builtin_strncpy(local_108 + 0x10,"5808",5);
  builtin_strncpy(local_108,"-922337203685477",0x10);
  builtin_strncpy(local_168,"9223372036854775808",0x14);
  builtin_strncpy(local_128 + 0x10,"5809",5);
  builtin_strncpy(local_128,"-922337203685477",0x10);
  local_238 = 0x35342e3433623231;
  local_230 = 0x36;
  builtin_strncpy(local_240,"1234b56",8);
  builtin_strncpy(local_188 + 8,"5   \n",6);
  builtin_strncpy(local_188,"   +1234",8);
  builtin_strncpy(local_224,"12345",6);
  builtin_strncpy(local_218,"00012345",9);
  builtin_strncpy(local_22c,"12345",6);
  local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
  local_260.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_260.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_260);
  if (cVar2 == '\0') {
    StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x557,local_178,local_260.fLocalForm,1);
    StrX::~StrX(&local_260);
    errSeen = 1;
  }
  local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
  local_260.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_260.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_260);
  if (cVar2 == '\0') {
    StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x558,local_1a8,local_260.fLocalForm,1);
    StrX::~StrX(&local_260);
    errSeen = 1;
  }
  local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
  local_260.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_260.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_260);
  if (cVar2 == '\0') {
    StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x559,local_1c8,local_260.fLocalForm,1);
    StrX::~StrX(&local_260);
    errSeen = 1;
  }
  local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
  local_260.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_260.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_260);
  if (cVar2 == '\0') {
    StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55a,local_1e8,local_260.fLocalForm,1);
    StrX::~StrX(&local_260);
    errSeen = 1;
  }
  local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
  local_260.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_260.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_260);
  if (cVar2 == '\0') {
    StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55b,local_208,local_260.fLocalForm,1);
    StrX::~StrX(&local_260);
    errSeen = 1;
  }
  local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
  local_260.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_238,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_260.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_238,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_260);
  if (cVar2 == '\0') {
    if ((int)local_250 != 6) {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      if (((ulong)local_250 & 0xffffffff) < 0xb) {
        pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_250 & 0xffffffff];
      }
      else {
        pcVar11 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x55e,&local_238,local_260.fLocalForm,"st_FOCA0002",pcVar11);
      goto LAB_0010a7df;
    }
  }
  else {
    StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55e,&local_238,local_260.fLocalForm,0);
LAB_0010a7df:
    StrX::~StrX(&local_260);
    errSeen = 1;
  }
  local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
  local_260.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_240,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_260.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_240,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_260);
  if (cVar2 == '\0') {
    if ((int)local_250 == 6) goto LAB_0010a8e8;
    StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    if (((ulong)local_250 & 0xffffffff) < 0xb) {
      pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_250 & 0xffffffff];
    }
    else {
      pcVar11 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x55f,local_240,local_260.fLocalForm,"st_FOCA0002",pcVar11);
  }
  else {
    StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55f,local_240,local_260.fLocalForm,0);
  }
  StrX::~StrX(&local_260);
  errSeen = 1;
LAB_0010a8e8:
  bVar12 = true;
  do {
    local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar10 = (void *)0x1f;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,bVar12,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x57c,local_178);
      StrX::~StrX(&local_260);
      errSeen = 1;
    }
    else {
      uStack_98 = 0x4d2;
      local_80 = local_38;
      local_90 = local_48;
      uStack_88 = uStack_40;
      expValue.fValue.f_long = 0x4d2;
      expValue._0_8_ = local_a0;
      expValue.fValue._8_8_ = local_48;
      expValue.fValue._16_8_ = uStack_40;
      expValue.fValue.f_datetime.f_milisec = (double)local_38;
      bVar3 = compareActualValue(dt_integer,*pXVar4,expValue);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar10);
    }
    local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar10 = (void *)0x1f;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,bVar12,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x57e,local_1a8);
      StrX::~StrX(&local_260);
      errSeen = 1;
    }
    else {
      uStack_c0 = 0x7fffffffffffffff;
      local_a8 = local_50;
      local_b8 = local_60;
      uStack_b0 = uStack_58;
      expValue_00.fValue.f_long = 0x7fffffffffffffff;
      expValue_00._0_8_ = local_c8;
      expValue_00.fValue._8_8_ = local_60;
      expValue_00.fValue._16_8_ = uStack_58;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_50;
      bVar3 = compareActualValue(dt_integer,*pXVar4,expValue_00);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar10);
    }
    local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar10 = (void *)0x1f;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,bVar12,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x57f,local_1c8);
      StrX::~StrX(&local_260);
      errSeen = 1;
    }
    else {
      uStack_e8 = 0x8000000000000000;
      local_d0 = local_68;
      local_e0 = local_78;
      uStack_d8 = uStack_70;
      expValue_01.fValue.f_long = 0x8000000000000000;
      expValue_01._0_8_ = local_f0;
      expValue_01.fValue._8_8_ = local_78;
      expValue_01.fValue._16_8_ = uStack_70;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_68;
      bVar3 = compareActualValue(dt_integer,*pXVar4,expValue_01);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar10);
    }
    local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,bVar12,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_250 != 8) {
        StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar11 = "st_UnknownType";
        if (((ulong)local_250 & 0xffffffff) < 0xb) {
          pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_250 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x580,local_1e8,local_260.fLocalForm,"st_FOCA0003",pcVar11);
        StrX::~StrX(&local_260);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pvVar10 = (void *)0x580;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x580,local_1e8);
      StrX::~StrX(&local_260);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
    }
    local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,bVar12,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_250 != 8) {
        StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar11 = "st_UnknownType";
        if (((ulong)local_250 & 0xffffffff) < 0xb) {
          pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_250 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x581,local_208,local_260.fLocalForm,"st_FOCA0003",pcVar11);
        StrX::~StrX(&local_260);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pvVar10 = (void *)0x581;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x581,local_208);
      StrX::~StrX(&local_260);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
    }
    local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_238,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_238,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,bVar12,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_250 != 6) {
        StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar11 = "st_UnknownType";
        if (((ulong)local_250 & 0xffffffff) < 0xb) {
          pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_250 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x583,&local_238,local_260.fLocalForm,"st_FOCA0002",pcVar11);
        StrX::~StrX(&local_260);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pvVar10 = (void *)0x583;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x583,&local_238);
      StrX::~StrX(&local_260);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
    }
    local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_240,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_240,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,bVar12,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_250 != 6) {
        StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar11 = "st_UnknownType";
        if (((ulong)local_250 & 0xffffffff) < 0xb) {
          pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_250 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x584,local_240,local_260.fLocalForm,"st_FOCA0002",pcVar11);
        StrX::~StrX(&local_260);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pvVar10 = (void *)0x584;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x584,local_240);
      StrX::~StrX(&local_260);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
    }
    bVar3 = bVar12 != false;
    bVar12 = false;
  } while (bVar3);
  uVar13 = CONCAT71((int7)((ulong)pXVar5 >> 8),1);
  do {
    local_244 = st_Init;
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_21c = (uint)uVar13;
    bVar12 = SUB81(uVar13,0);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_260.fUnicodeForm,dt_integer,&local_244,ver_10,bVar12,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a2,local_188);
      StrX::~StrX(&local_260);
      errSeen = 1;
    }
    else {
      local_250 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar11 = local_224;
      if (local_250 != pcVar11) {
        pcVar7 = local_250;
        if (local_250 == (char *)0x0) {
LAB_0010b1ec:
          if (*pcVar11 == '\0') goto LAB_0010b23c;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0010b1ec;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a2,local_188,local_260.fLocalForm,local_250,local_224);
        StrX::~StrX(&local_260);
        errSeen = 1;
      }
LAB_0010b23c:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_250,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_244 = st_Init;
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_218,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_218,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_260.fUnicodeForm,dt_integer,&local_244,ver_10,bVar12,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a3,local_218);
      StrX::~StrX(&local_260);
      errSeen = 1;
    }
    else {
      local_250 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar11 = local_22c;
      if (local_250 != pcVar11) {
        pcVar7 = local_250;
        if (local_250 == (char *)0x0) {
LAB_0010b32d:
          if (*pcVar11 == '\0') goto LAB_0010b37d;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0010b32d;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a3,local_218,local_260.fLocalForm,local_250,local_22c);
        StrX::~StrX(&local_260);
        errSeen = 1;
      }
LAB_0010b37d:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_250,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_244 = st_Init;
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_260.fUnicodeForm,dt_integer,&local_244,ver_10,bVar12,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a5,local_1a8);
      StrX::~StrX(&local_260);
      errSeen = 1;
    }
    else {
      local_250 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar11 = local_148;
      if (local_250 != pcVar11) {
        pcVar7 = local_250;
        if (local_250 == (char *)0x0) {
LAB_0010b46e:
          if (*pcVar11 == '\0') goto LAB_0010b4be;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0010b46e;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a5,local_1a8,local_260.fLocalForm,local_250,local_148);
        StrX::~StrX(&local_260);
        errSeen = 1;
      }
LAB_0010b4be:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_250,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_244 = st_Init;
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_260.fUnicodeForm,dt_integer,&local_244,ver_10,bVar12,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a6,local_1c8);
      StrX::~StrX(&local_260);
      errSeen = 1;
    }
    else {
      local_250 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar11 = local_108;
      if (local_250 != pcVar11) {
        pcVar7 = local_250;
        if (local_250 == (char *)0x0) {
LAB_0010b5af:
          if (*pcVar11 == '\0') goto LAB_0010b5ff;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0010b5af;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a6,local_1c8,local_260.fLocalForm,local_250,local_108);
        StrX::~StrX(&local_260);
        errSeen = 1;
      }
LAB_0010b5ff:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_250,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_244 = st_Init;
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_260.fUnicodeForm,dt_integer,&local_244,ver_10,bVar12,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a7,local_1e8);
      StrX::~StrX(&local_260);
      errSeen = 1;
    }
    else {
      local_250 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar11 = local_168;
      if (local_250 != pcVar11) {
        pcVar7 = local_250;
        if (local_250 == (char *)0x0) {
LAB_0010b6f0:
          if (*pcVar11 == '\0') goto LAB_0010b740;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0010b6f0;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a7,local_1e8,local_260.fLocalForm,local_250,local_168);
        StrX::~StrX(&local_260);
        errSeen = 1;
      }
LAB_0010b740:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_250,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_244 = st_Init;
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_260.fUnicodeForm,dt_integer,&local_244,ver_10,bVar12,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a8,local_208);
      StrX::~StrX(&local_260);
      errSeen = 1;
    }
    else {
      local_250 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar11 = local_128;
      if (local_250 != pcVar11) {
        pcVar7 = local_250;
        if (local_250 == (char *)0x0) {
LAB_0010b834:
          if (*pcVar11 == '\0') goto LAB_0010b884;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0010b834;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a8,local_208,local_260.fLocalForm,local_250,local_128);
        StrX::~StrX(&local_260);
        errSeen = 1;
      }
LAB_0010b884:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_250,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_238,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_238,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,bVar12,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    uVar9 = local_21c;
    if (lVar8 == 0) {
      if ((int)local_250 != 6) {
        StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar11 = "st_UnknownType";
        if (((ulong)local_250 & 0xffffffff) < 0xb) {
          pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_250 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x5a9,&local_238,local_260.fLocalForm,"st_FOCA0002",pcVar11);
        StrX::~StrX(&local_260);
        goto LAB_0010b9b6;
      }
    }
    else {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a9,&local_238);
      StrX::~StrX(&local_260);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
      uVar9 = local_21c;
LAB_0010b9b6:
      errSeen = 1;
    }
    local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
    local_260.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_240,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_260.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_240,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_260.fUnicodeForm,dt_integer,(Status *)&local_250,ver_10,bVar12,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_260);
    if (lVar8 == 0) {
      if ((int)local_250 != 6) {
        StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar11 = "st_UnknownType";
        if (((ulong)local_250 & 0xffffffff) < 0xb) {
          pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_250 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x5aa,local_240,local_260.fLocalForm,"st_FOCA0002",pcVar11);
        StrX::~StrX(&local_260);
        goto LAB_0010bab6;
      }
    }
    else {
      StrX::StrX(&local_260,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5aa,local_240);
      StrX::~StrX(&local_260);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0010bab6:
      errSeen = 1;
    }
    uVar13 = 0;
    if ((uVar9 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_integer()
{
    const XSValue::DataType dt = XSValue::dt_integer;
    bool  toValidate = true;

    const char lex_v_ran_v_1[]="   1234    \n";
    const char lex_v_ran64_v_1[]="+9223372036854775807";
    const char lex_v_ran64_v_2[]="-9223372036854775808";
    const char lex_v_ran64_iv_1[]="+9223372036854775808";
    const char lex_v_ran64_iv_2[]="-9223372036854775809";

    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_long = (int64_t)1234ll;
    XSValue::XSValue_Data act_v_ran64_v_1; act_v_ran64_v_1.fValue.f_long = (int64_t)+9223372036854775807ll;
    XSValue::XSValue_Data act_v_ran64_v_2; act_v_ran64_v_2.fValue.f_long = (int64_t)-9223372036854775808ll;
    XSValue::XSValue_Data act_v_ran32_v_1; act_v_ran32_v_1.fValue.f_long = (int64_t)+2147483647ll;
    XSValue::XSValue_Data act_v_ran32_v_2; act_v_ran32_v_2.fValue.f_long = (int64_t)-2147483648ll;

    const char lex_v_ran64_v_1_canrep[]="9223372036854775807";
    const char lex_v_ran64_v_2_canrep[]="-9223372036854775808";
    const char lex_v_ran64_iv_1_canrep[]="9223372036854775808";
    const char lex_v_ran64_iv_2_canrep[]="-9223372036854775809";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.13.2 Canonical representation
 *
 * The canonical representation for integer is defined by prohibiting certain options from the Lexical
 * representation (3.3.13.1). Specifically,
 * 1. the preceding optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +12345   \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid       n/a
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid
    VALIDATE_TEST(lex_v_ran_v_1    , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_1,    dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);

        ACTVALUE_TEST(lex_v_ran64_v_1 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_1);
        ACTVALUE_TEST(lex_v_ran64_v_2 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_2);
        ACTVALUE_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0003, act_v_ran64_v_1);
        ACTVALUE_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0003, act_v_ran64_v_1);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran64_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_1_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_2_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_2_canrep, DONT_CARE);
        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

}